

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# licm_pass.cpp
# Opt level: O3

Status __thiscall spvtools::opt::LICMPass::ProcessLoop(LICMPass *this,Loop *loop,Function *f)

{
  pointer ppLVar1;
  Status SVar2;
  Status SVar3;
  ulong uVar4;
  pointer ppLVar5;
  bool bVar6;
  vector<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_> local_48;
  
  ppLVar1 = (loop->nested_loops_).
            super__Vector_base<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if (ppLVar1 ==
      (loop->nested_loops_).
      super__Vector_base<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    SVar3 = SuccessWithoutChange;
  }
  else {
    SVar3 = SuccessWithoutChange;
    do {
      ppLVar5 = ppLVar1 + 1;
      SVar2 = ProcessLoop(this,*ppLVar1,f);
      if ((int)SVar2 < (int)SVar3) {
        SVar3 = SVar2;
      }
    } while ((SVar3 != Failure) &&
            (ppLVar1 = ppLVar5,
            ppLVar5 !=
            (loop->nested_loops_).
            super__Vector_base<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>.
            _M_impl.super__Vector_impl_data._M_finish));
  }
  local_48.
  super__Vector_base<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_48.
  super__Vector_base<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48.
  super__Vector_base<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  SVar2 = AnalyseAndHoistFromBB(this,loop,f,loop->loop_header_,&local_48);
  if ((int)SVar2 < (int)SVar3) {
    SVar3 = SVar2;
  }
  if ((SVar3 != Failure) &&
     (local_48.
      super__Vector_base<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>.
      _M_impl.super__Vector_impl_data._M_finish !=
      local_48.
      super__Vector_base<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>.
      _M_impl.super__Vector_impl_data._M_start)) {
    uVar4 = 1;
    do {
      SVar2 = AnalyseAndHoistFromBB
                        (this,loop,f,
                         local_48.
                         super__Vector_base<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>
                         ._M_impl.super__Vector_impl_data._M_start[uVar4 - 1],&local_48);
      if ((int)SVar2 < (int)SVar3) {
        SVar3 = SVar2;
      }
    } while ((SVar3 != Failure) &&
            (bVar6 = uVar4 < (ulong)((long)local_48.
                                           super__Vector_base<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>
                                           ._M_impl.super__Vector_impl_data._M_finish -
                                     (long)local_48.
                                           super__Vector_base<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>
                                           ._M_impl.super__Vector_impl_data._M_start >> 3),
            uVar4 = uVar4 + 1, bVar6));
  }
  if (local_48.
      super__Vector_base<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_48.
                    super__Vector_base<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_48.
                          super__Vector_base<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_48.
                          super__Vector_base<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return SVar3;
}

Assistant:

Pass::Status LICMPass::ProcessLoop(Loop* loop, Function* f) {
  Status status = Status::SuccessWithoutChange;

  // Process all nested loops first
  for (auto nl = loop->begin(); nl != loop->end() && status != Status::Failure;
       ++nl) {
    Loop* nested_loop = *nl;
    status = CombineStatus(status, ProcessLoop(nested_loop, f));
  }

  std::vector<BasicBlock*> loop_bbs{};
  status = CombineStatus(
      status,
      AnalyseAndHoistFromBB(loop, f, loop->GetHeaderBlock(), &loop_bbs));

  for (size_t i = 0; i < loop_bbs.size() && status != Status::Failure; ++i) {
    BasicBlock* bb = loop_bbs[i];
    // do not delete the element
    status =
        CombineStatus(status, AnalyseAndHoistFromBB(loop, f, bb, &loop_bbs));
  }

  return status;
}